

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::InvalidError::~InvalidError(InvalidError *this)

{
  InvalidError *this_local;
  
  ~InvalidError(this);
  operator_delete(this);
  return;
}

Assistant:

explicit InvalidError(std::string name)
        : InvalidError(name + ": Too many positional arguments with unlimited expected args", ExitCodes::InvalidError) {
    }